

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_queue_entry.hpp
# Opt level: O0

void __thiscall libtorrent::aux::bw_request::~bw_request(bw_request *this)

{
  bw_request *this_local;
  
  ::std::shared_ptr<libtorrent::aux::bandwidth_socket>::~shared_ptr(&this->peer);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT bw_request
{
	bw_request(std::shared_ptr<bandwidth_socket> pe
		, int blk, int prio);

	std::shared_ptr<bandwidth_socket> peer;
	// 1 is normal prio
	int priority;
	// the number of bytes assigned to this request so far
	int assigned;
	// once assigned reaches this, we dispatch the request function
	int request_size;

	// the max number of rounds for this request to survive
	// this ensures that requests gets responses at very low
	// rate limits, when the requested size would take a long
	// time to satisfy
	int ttl;

	// loops over the bandwidth channels and assigns bandwidth
	// from the most limiting one
	int assign_bandwidth();

	static constexpr int max_bandwidth_channels = 10;
	// we don't actually support more than 10 channels per peer
	aux::array<bandwidth_channel*, max_bandwidth_channels> channel{};
}